

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O0

void __thiscall Centaurus::Stream::skip_multiline_comment(Stream *this)

{
  wchar_t wVar1;
  StreamException *__return_storage_ptr__;
  wchar_t local_14;
  wchar_t ch;
  Stream *this_local;
  
  local_14 = get(this);
  while( true ) {
    if (local_14 == L'\0') {
      __return_storage_ptr__ = (StreamException *)__cxa_allocate_exception(0x28);
      unexpected(__return_storage_ptr__,this,L'\xffffffff');
      __cxa_throw(__return_storage_ptr__,&StreamException::typeinfo,
                  StreamException::~StreamException);
    }
    if ((local_14 == L'*') && (wVar1 = peek(this), wVar1 == L'/')) break;
    local_14 = get(this);
  }
  get(this);
  return;
}

Assistant:

void skip_multiline_comment()
    {
        wchar_t ch = get();
        for (; ch != L'\0'; ch = get())
        {
            if (ch == L'*')
            {
                ch = peek();
                if (ch == L'/')
                {
                    get();
                    return;
                }
            }
        }
        throw unexpected(EOF);
    }